

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_multi_assign_reference.cpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformMultiAssignRef(Transformer *this,PGMultiAssignRef *root)

{
  bool bVar1;
  PGFuncCall *__src;
  PGValue *pPVar2;
  undefined8 uVar3;
  long in_RDX;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> in_RDI;
  optional_ptr<duckdb_libpgquery::PGNode,_true> node;
  PGListCell *list;
  int64_t idx;
  int64_t value_count;
  char *function_name;
  optional_ptr<duckdb_libpgquery::PGValue,_true> function;
  PGFuncCall func;
  void *in_stack_fffffffffffffe38;
  optional_ptr<duckdb_libpgquery::PGValue,_true> *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  undefined1 uVar5;
  optional_ptr<duckdb_libpgquery::PGNode,_true> in_stack_fffffffffffffe58;
  int local_198;
  allocator *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  string *psVar6;
  allocator *in_stack_fffffffffffffe80;
  int params;
  undefined7 in_stack_fffffffffffffe88;
  byte bVar7;
  byte bVar8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_00;
  allocator local_141;
  string local_140 [32];
  long local_120;
  long local_118;
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  long local_e8;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_e0;
  byte local_d3;
  byte local_d2;
  allocator local_d1;
  string local_d0 [35];
  byte local_ad;
  byte local_9a;
  allocator local_99;
  string local_98 [32];
  string *local_78;
  PGValue *local_70;
  undefined1 local_68 [16];
  long local_58;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_20;
  long local_18;
  
  if (**(int **)(in_RDX + 8) == 0x165) {
    this_00._M_head_impl =
         (ParsedExpression *)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    local_18 = in_RDX;
    __src = PGCast<duckdb_libpgquery::PGFuncCall>(*(PGNode **)(in_RDX + 8));
    memcpy(local_68,__src,0x48);
    local_70 = (PGValue *)PGPointerCast<duckdb_libpgquery::PGValue>(in_stack_fffffffffffffe38);
    pPVar2 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(in_stack_fffffffffffffe40);
    psVar6 = (string *)(pPVar2->val).str;
    local_9a = 0;
    local_ad = 0;
    local_d2 = 0;
    local_d3 = 0;
    bVar7 = 1;
    local_78 = psVar6;
    if (psVar6 != (string *)0x0) {
      in_stack_fffffffffffffe80 = &local_99;
      ::std::allocator<char>::allocator();
      local_9a = 1;
      ::std::__cxx11::string::string(local_98,(char *)psVar6,in_stack_fffffffffffffe80);
      local_ad = 1;
      in_stack_fffffffffffffe70 = &local_d1;
      ::std::allocator<char>::allocator();
      local_d2 = 1;
      ::std::__cxx11::string::string(local_d0,"row",in_stack_fffffffffffffe70);
      local_d3 = 1;
      bVar1 = StringUtil::CIEquals
                        ((string *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe48);
      bVar7 = bVar1 ^ 0xff;
      in_stack_fffffffffffffe78 = psVar6;
    }
    bVar8 = bVar7;
    if ((local_d3 & 1) != 0) {
      ::std::__cxx11::string::~string(local_d0);
    }
    if ((local_d2 & 1) != 0) {
      ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    if ((local_ad & 1) != 0) {
      ::std::__cxx11::string::~string(local_98);
    }
    if ((local_9a & 1) != 0) {
      ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    if ((bVar7 & 1) == 0) {
      if (local_58 == 0) {
        local_198 = 0;
      }
      else {
        local_198 = *(int *)(local_58 + 4);
      }
      local_e8 = (long)local_198;
      if ((*(int *)(local_18 + 0x14) < local_e8) || (local_58 == 0)) {
        local_10a = 1;
        uVar3 = __cxa_allocate_exception(0x10);
        params = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_108,"Could not perform assignment, expected %d values, got %d",&local_109);
        ParserException::ParserException<int,long>
                  ((ParserException *)this_00._M_head_impl,
                   (string *)CONCAT17(bVar8,in_stack_fffffffffffffe88),params,
                   (long)in_stack_fffffffffffffe78);
        local_10a = 0;
        __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
      }
      local_118 = 1;
      local_120 = *(long *)(local_58 + 8);
      while( true ) {
        uVar5 = false;
        if (local_120 != 0) {
          uVar5 = local_118 < *(int *)(local_18 + 0x10);
        }
        if ((bool)uVar5 == false) break;
        local_120 = *(long *)(local_120 + 8);
        local_118 = local_118 + 1;
      }
      if (local_120 == 0) {
        uVar3 = __cxa_allocate_exception(0x10);
        paVar4 = &local_141;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_140,"Could not perform assignment, expected %d values, got %d",paVar4);
        ParserException::ParserException<int,int>
                  ((ParserException *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                   (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),(int)in_stack_fffffffffffffe70);
        __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
      }
      PGPointerCast<duckdb_libpgquery::PGNode>(in_stack_fffffffffffffe38);
      TransformExpression((Transformer *)CONCAT17(uVar5,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe58);
    }
    else {
      optional_ptr<duckdb_libpgquery::PGNode,_true>::optional_ptr
                (&local_e0,*(PGNode **)(local_18 + 8));
      TransformExpression((Transformer *)
                          CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe58);
    }
  }
  else {
    optional_ptr<duckdb_libpgquery::PGNode,_true>::optional_ptr(&local_20,*(PGNode **)(in_RDX + 8));
    TransformExpression((Transformer *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50)
                        ,in_stack_fffffffffffffe58);
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformMultiAssignRef(duckdb_libpgquery::PGMultiAssignRef &root) {

	// Early-out, if the root is not a function call.
	if (root.source->type != duckdb_libpgquery::T_PGFuncCall) {
		return TransformExpression(root.source);
	}

	auto func = PGCast<duckdb_libpgquery::PGFuncCall>(*root.source);

	// Only allow ROW function.
	auto function = PGPointerCast<duckdb_libpgquery::PGValue>(func.funcname->tail->data.ptr_value);
	char const *function_name = function->val.str;
	if (!function_name || !StringUtil::CIEquals(function_name, "row")) {
		return TransformExpression(root.source);
	}

	// Too many columns, e.g., (x, y) != (1, 2, 3).
	int64_t value_count = func.args ? func.args->length : 0;
	if (int64_t(root.ncolumns) < value_count || !func.args) {
		throw ParserException("Could not perform assignment, expected %d values, got %d", root.ncolumns, value_count);
	}

	// Get the expression corresponding with the current column.
	int64_t idx = 1;
	auto list = func.args->head;
	while (list && idx < int64_t(root.colno)) {
		list = list->next;
		++idx;
	}

	// Not enough columns, e.g., (x, y, z) != (1, 2).
	if (!list) {
		throw ParserException("Could not perform assignment, expected %d values, got %d", root.ncolumns,
		                      func.args->length);
	}

	auto node = PGPointerCast<duckdb_libpgquery::PGNode>(list->data.ptr_value);
	return TransformExpression(node);
}